

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  pointer pcVar1;
  App_p *subcomptr;
  pointer puVar2;
  OptionNotFound *this_00;
  string local_40;
  
  puVar2 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (puVar2 == (this->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar1 = (subcom->name_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (subcom->name_)._M_string_length);
      OptionNotFound::OptionNotFound(this_00,&local_40);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
    }
    if ((puVar2->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
        super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
        super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl == subcom) break;
    puVar2 = puVar2 + 1;
  }
  return subcom;
}

Assistant:

App *get_subcommand(App *subcom) const {
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcom;
        throw OptionNotFound(subcom->get_name());
    }